

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O1

int Test_SUNLinSolResNorm(SUNLinearSolver S,int myid)

{
  int iVar1;
  realtype rVar2;
  
  rVar2 = SUNLinSolResNorm(S);
  if (0.0 <= rVar2) {
    iVar1 = 0;
    if (myid == 0) {
      puts("    PASSED test -- SUNLinSolResNorm");
      iVar1 = 0;
      if (print_time != 0) {
        printf("    SUNLinSolResNorm Time: %22.15e \n \n",0);
      }
    }
  }
  else {
    printf(">>> FAILED test -- SUNLinSolResNorm returned %g on Proc %d \n",myid);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Test_SUNLinSolResNorm(SUNLinearSolver S, int myid)
{
  double start_time, stop_time, resnorm;

  /* this test can fail if the function is NULL, which will cause a seg-fault */
  start_time = get_time();   
  resnorm = (double) SUNLinSolResNorm(S);
  stop_time = get_time();   

  /* this test can also fail if the return value is negative */
  if (resnorm < ZERO){
    printf(">>> FAILED test -- SUNLinSolResNorm returned %g on Proc %d \n", 
           resnorm, myid);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNLinSolResNorm\n");
    PRINT_TIME("    SUNLinSolResNorm Time: %22.15e \n \n", stop_time - start_time);
  }

  return(0);
}